

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall acto::core::event::signaled(event *this)

{
  std::mutex::lock(&this->mutex_);
  this->triggered_ = true;
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void event::signaled() {
  std::lock_guard g(mutex_);

  triggered_ = true;
  cond_.notify_one();
}